

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_info.hpp
# Opt level: O3

ArrowStringInfo * __thiscall
duckdb::ArrowTypeInfo::Cast<duckdb::ArrowStringInfo>(ArrowTypeInfo *this)

{
  InternalException *this_00;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->type == STRING) {
    return (ArrowStringInfo *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "Failed to cast ArrowTypeInfo, type mismatch (expected: %s, got: %s)","");
  EnumUtil::ToString<duckdb::ArrowTypeInfoType>(&local_40,STRING);
  EnumUtil::ToString<duckdb::ArrowTypeInfoType>(&local_60,this->type);
  InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_80,&local_40,&local_60);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		D_ASSERT(dynamic_cast<TARGET *>(this));
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast ArrowTypeInfo, type mismatch (expected: %s, got: %s)",
			                        EnumUtil::ToString(TARGET::TYPE), EnumUtil::ToString(type));
		}
		return reinterpret_cast<TARGET &>(*this);
	}